

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbscreen_p.cpp
# Opt level: O0

void * __thiscall QFbScreen::qt_metacast(QFbScreen *this,char *_clname)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = strcmp(in_RSI,qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN9QFbScreenE_t>
                          .strings);
    local_8 = in_RDI;
    if (iVar1 != 0) {
      iVar1 = strcmp(in_RSI,"QPlatformScreen");
      if (iVar1 == 0) {
        local_8 = in_RDI + 0x10;
      }
      else {
        local_8 = (char *)QObject::qt_metacast(in_RDI);
      }
    }
  }
  return local_8;
}

Assistant:

void *QFbScreen::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN9QFbScreenE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QPlatformScreen"))
        return static_cast< QPlatformScreen*>(this);
    return QObject::qt_metacast(_clname);
}